

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O1

RateAdaptiveCode<unsigned_int> * __thiscall
LDPC4QKD::CodeSimulationHelpers::load_ldpc_from_json<bool,unsigned_int,unsigned_int>
          (RateAdaptiveCode<unsigned_int> *__return_storage_ptr__,CodeSimulationHelpers *this,
          string *json_file_path,string *rate_adaption_file_path)

{
  bool bVar1;
  reference pvVar2;
  runtime_error *prVar3;
  json data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rowval;
  vector<unsigned_int,_std::allocator<unsigned_int>_> colptr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rows_to_combine;
  ifstream fs;
  ifstream f;
  data dStack_4f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_488;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_470;
  _Any_data local_458;
  code *local_448;
  undefined8 uStack_440;
  long local_438 [4];
  byte abStack_418 [488];
  basic_ifstream<char,_std::char_traits<char>_> local_230 [520];
  
  std::ifstream::ifstream(local_438,(string *)this,_S_in);
  if ((abStack_418[*(long *)(local_438[0] + -0x18)] & 5) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Invalid file.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(local_230,(string *)this,_S_in);
  local_458._M_unused._M_object = (void *)0x0;
  local_458._8_8_ = 0;
  local_448 = (code *)0x0;
  uStack_440 = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<std::ifstream&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)&dStack_4f8,local_230,(parser_callback_t *)&local_458,true,false);
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&dStack_4f8,"format");
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator==<const_char_*>(pvVar2,"BINCSCJSON");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&dStack_4f8,"colptr");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_0>(&local_4d0,pvVar2);
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&dStack_4f8,"rowval");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_0>(&local_4e8,pvVar2);
    if (json_file_path->_M_string_length == 0) {
      RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
                (__return_storage_ptr__,&local_4d0,&local_4e8);
    }
    else {
      read_rate_adaption_from_csv<unsigned_int>(&local_470,json_file_path);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_488,&local_4d0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4a0,&local_4e8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4b8,&local_470);
      RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
                (__return_storage_ptr__,&local_488,&local_4a0,&local_4b8,0);
      if (local_4b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_4b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_4a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_488.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_488.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_470.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_470.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_4d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&dStack_4f8,false);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&dStack_4f8);
    std::ifstream::~ifstream(local_230);
    std::ifstream::~ifstream(local_438);
    return __return_storage_ptr__;
  }
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&dStack_4f8,"format");
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator==<const_char_*>(pvVar2,"COMPRESSED_SPARSE_COLUMN");
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  if (bVar1) {
    std::runtime_error::runtime_error
              (prVar3,
               "Reading QC-exponents not supported yet! Use LDPCStorage.jl to convert to bincsc.json format!"
              );
  }
  else {
    std::runtime_error::runtime_error(prVar3,"Unexpected format within json file.");
  }
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LDPC4QKD::RateAdaptiveCode<idx_t> load_ldpc_from_json(
            const std::string &json_file_path, const std::string &rate_adaption_file_path = ""
    ) {
        try {
            std::ifstream fs(json_file_path);
            if (!fs) {
                throw std::runtime_error("Invalid file.");
            }

            // parse JSON file
            using json = nlohmann::json;
            std::ifstream f(json_file_path);
            json data = json::parse(f);

            if (data["format"] == "BINCSCJSON") { // binary matrix stored
                std::vector<colptr_t> colptr = data["colptr"];
                std::vector<idx_t> rowval = data["rowval"];

                if (rate_adaption_file_path.empty()) {
                    return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, rowval);
                } else {
                    std::vector<idx_t> rows_to_combine = read_rate_adaption_from_csv<idx_t>(rate_adaption_file_path);
                    return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, rowval, rows_to_combine);
                }
            } else if (data["format"] == "COMPRESSED_SPARSE_COLUMN") { // quasi-cyclic exponents stored
//                std::vector<std::uint64_t> colptr = data["colptr"];
//                std::vector<std::uint64_t> rowval = data["rowval"];
//                std::vector<std::uint64_t> nzval = data["nzval"];
                    // TODO reconstructing the matrix from qc-exponents and storing as sparse needs some work...
                throw std::runtime_error("Reading QC-exponents not supported yet! Use LDPCStorage.jl to convert to bincsc.json format!");
            } else {
                throw std::runtime_error("Unexpected format within json file.");
            }
        } catch (const std::exception &e) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << json_file_path << "'. Reason:\n" << e.what() << "\n";
            throw std::runtime_error(s.str());
        } catch (...) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << json_file_path << "' due to unknown error.";
            throw std::runtime_error(s.str());
        }
    }